

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

bool __thiscall Assembler::checkIfEnd(Assembler *this,string *line)

{
  int iVar1;
  bool bVar2;
  NothingAfterLabelError *this_00;
  pointer ppVar3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
  local_58 [3];
  undefined1 local_40 [8];
  smatch end;
  string *line_local;
  Assembler *this_local;
  
  end._M_begin._M_current = (char *)line;
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)local_40);
  bVar2 = std::
          regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                    (line,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_40,&endDirectiveReg_abi_cxx11_,0);
  if (bVar2) {
    bVar2 = std::operator!=(&currentSectionName_abi_cxx11_,"");
    if ((bVar2) && ((first & 1U) != 0)) {
      if ((this->isLabelWithoutCode & 1U) != 0) {
        this_00 = (NothingAfterLabelError *)__cxa_allocate_exception(8);
        *this_00 = (NothingAfterLabelError)0x0;
        NothingAfterLabelError::NothingAfterLabelError(this_00);
        __cxa_throw(this_00,&NothingAfterLabelError::typeinfo,
                    NothingAfterLabelError::~NothingAfterLabelError);
      }
      this->isLabelWithoutCode = false;
      iVar1 = locationCounter;
      local_58[0]._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>_>
           ::find(&this->symbolTable,&currentSectionName_abi_cxx11_);
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assembler::symbolTableEntry>_>
               ::operator->(local_58);
      (ppVar3->second).size = iVar1;
    }
    isGlobalFirst = false;
    isEnd = true;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    *)local_40);
  return this_local._7_1_;
}

Assistant:

bool Assembler::checkIfEnd(string line) {
    smatch end;
    if (regex_match(line, end, endDirectiveReg)) {
        if ((currentSectionName != "") && first) {

            if (isLabelWithoutCode) throw NothingAfterLabelError();
            isLabelWithoutCode = false;
            symbolTable.find(currentSectionName)->second.size = locationCounter;
        }
        isGlobalFirst = false;
        isEnd = true;
        return true;
    } else return false;
}